

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QPoint __thiscall
QMdi::MinOverlapPlacer::place(MinOverlapPlacer *this,QSize *size,QList<QRect> *rects,QRect *domain)

{
  Representation *pRVar1;
  Representation *pRVar2;
  ulong uVar3;
  QPoint QVar4;
  long lVar5;
  QRect *pQVar6;
  QList<QRect> *__range1;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QRect> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  if (0 < (size->wd).m_i) {
    uVar3 = 0;
    if ((size->ht).m_i < 1) goto LAB_0040b0b4;
    uVar7 = 0;
    if ((domain->x1).m_i <= (domain->x2).m_i) {
      uVar3 = 0;
      if ((domain->y1).m_i <= (domain->y2).m_i) {
        lVar5 = (rects->d).size << 4;
        uVar7 = 0;
        pQVar6 = (rects->d).ptr;
        do {
          if (lVar5 == 0) {
            local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_48.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
            getCandidatePlacements((QList<QRect> *)&local_48,size,rects,domain);
            QVar4 = findBestPlacement(domain,rects,(QList<QRect> *)&local_48);
            uVar7 = (ulong)QVar4 & 0xffffffff00000000;
            QArrayDataPointer<QRect>::~QArrayDataPointer(&local_48);
            uVar3 = (ulong)QVar4 & 0xffffffff;
            break;
          }
          if ((pQVar6->x2).m_i < (pQVar6->x1).m_i) goto LAB_0040b05e;
          pRVar1 = &pQVar6->y2;
          lVar5 = lVar5 + -0x10;
          uVar3 = 0;
          pRVar2 = &pQVar6->y1;
          pQVar6 = pQVar6 + 1;
        } while (pRVar2->m_i <= pRVar1->m_i);
      }
      goto LAB_0040b0b4;
    }
  }
LAB_0040b05e:
  uVar7 = 0;
  uVar3 = 0;
LAB_0040b0b4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QPoint)(uVar3 | uVar7);
}

Assistant:

QPoint MinOverlapPlacer::place(const QSize &size, const QList<QRect> &rects,
                               const QRect &domain) const
{
    if (size.isEmpty() || !domain.isValid())
        return QPoint();
    for (const QRect &rect : rects) {
        if (!rect.isValid())
            return QPoint();
    }

    QList<QRect> candidates = getCandidatePlacements(size, rects, domain);
    return findBestPlacement(domain, rects, candidates);
}